

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

void tokpragma(tokcxdef *ctx,char *p,int len)

{
  byte bVar1;
  char cVar2;
  ushort **ppuVar3;
  long lVar4;
  
  if (((len != 0) && (1 < len)) && ((byte)(*p | 0x20U) == 99)) {
    bVar1 = p[1];
    if (((bVar1 == 0x2b) || (bVar1 == 0x2d)) ||
       ((-1 < (char)bVar1 &&
        (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (ulong)bVar1 * 2 + 1) & 0x20) != 0))
       )) {
      lVar4 = 1;
      do {
        cVar2 = p[lVar4];
        if ((long)cVar2 < 0) break;
        ppuVar3 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar3 + (long)cVar2 * 2 + 1) & 0x20) == 0) {
          if (cVar2 == '-') {
            *(byte *)&ctx->tokcxflg = (byte)ctx->tokcxflg & 0xfb;
          }
          else {
            if (cVar2 != '+') break;
            *(byte *)&ctx->tokcxflg = (byte)ctx->tokcxflg | 4;
          }
          return;
        }
        lVar4 = lVar4 + 1;
      } while (len != (int)lVar4);
    }
  }
  errlogf(ctx->tokcxerr,"TADS",0x70);
  return;
}

Assistant:

static void tokpragma(tokcxdef *ctx, char *p, int len)
{
    /* ignore empty pragmas */
    if (len == 0)
    {
        errlog(ctx->tokcxerr, ERR_PRAGMA);
        return;
    }

    /* see what we have */
    if (len > 1
        && (*p == 'c' || *p == 'C')
        && (*(p+1) == '+' || *(p+1) == '-' || t_isspace(*(p+1))))
    {
        /* skip spaces after the 'C', if any */
        for (++p, --len ; len && t_isspace(*p) ; ++p, --len) ;

        /* look for the + or - flag */
        if (len && *p == '+')
            ctx->tokcxflg |= TOKCXFCMODE;
        else if (len && *p == '-')
            ctx->tokcxflg &= ~TOKCXFCMODE;
        else
        {
            errlog(ctx->tokcxerr, ERR_PRAGMA);
            return;
        }
    }
    else
    {
        errlog(ctx->tokcxerr, ERR_PRAGMA);
    }
}